

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

PlotGroup * gnuplotio::Gnuplot::splotGroup(void)

{
  PlotGroup *in_RDI;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"splot",&local_31);
  PlotGroup::PlotGroup(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static PlotGroup splotGroup() {
        return PlotGroup("splot");
    }